

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetEnumValueInternal
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  int number;
  Type TVar2;
  ExtensionSet *this_00;
  int local_24;
  FieldDescriptor *pFStack_20;
  int value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_24 = value;
  pFStack_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(pFStack_20);
    TVar2 = FieldDescriptor::type(pFStack_20);
    ExtensionSet::SetEnum(this_00,number,(FieldType)TVar2,local_24,pFStack_20);
  }
  else {
    SetField<int>(this,(Message *)field_local,pFStack_20,&local_24);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SetEnumValueInternal(
    Message* message, const FieldDescriptor* field,
    int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetEnum(field->number(), field->type(),
                                          value, field);
  } else {
    SetField<int>(message, field, value);
  }
}